

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

Simplex_handle __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::find<int[2]>
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,int (*s) [2])

{
  int *in_RDX;
  vector<int,_std::allocator<int>_> copy;
  allocator_type local_31;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&local_30,in_RDX,in_RDX + 2,&local_31);
  std::
  __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_30._M_impl.super__Vector_impl_data._M_start,
             local_30._M_impl.super__Vector_impl_data._M_finish);
  find_simplex(this,(vector<int,_std::allocator<int>_> *)s);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return (Simplex_handle)
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)this;
}

Assistant:

Simplex_handle find(const InputVertexRange & s) const {
    auto first = std::begin(s);
    auto last = std::end(s);

    if (first == last)
      return null_simplex();  // ----->>

    // Copy before sorting
    std::vector<Vertex_handle> copy(first, last);
    std::sort(std::begin(copy), std::end(copy));
    return find_simplex(copy);
  }